

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

void am_check_list_slot(Am_Slot_Key slot,Am_Value *v,Am_Object *created_obj,
                       Am_Value_List *slots_to_save,Am_Value_List *pos_slots)

{
  bool bVar1;
  Am_Value *in_value;
  undefined6 in_register_0000003a;
  Am_Value local_40;
  
  local_40.type = 2;
  local_40.value.long_value = CONCAT62(in_register_0000003a,slot) & 0xffffffff;
  bVar1 = Am_Value_List::Start_Member(slots_to_save,&local_40);
  Am_Value::~Am_Value(&local_40);
  if (bVar1) {
    Am_Value_List::Delete(slots_to_save,false);
    Am_Value_List::Add(pos_slots,(int)CONCAT62(in_register_0000003a,slot),Am_TAIL,true);
    bVar1 = Am_Object::Valid(created_obj);
    if (bVar1) {
      in_value = Am_Object::Get(created_obj,slot,0);
      Am_Value::operator=(v,in_value);
    }
  }
  return;
}

Assistant:

void
am_check_list_slot(Am_Slot_Key slot, Am_Value &v, Am_Object &created_obj,
                   Am_Value_List &slots_to_save, Am_Value_List &pos_slots)
{
  if (slots_to_save.Start_Member(slot)) {
    slots_to_save.Delete(false); //remove it
    pos_slots.Add(slot);
    if (created_obj.Valid())
      v = created_obj.Get(slot);
  }
}